

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Array<unsigned_long> * __thiscall
capnp::Schema::getGenericScopeIds(Array<unsigned_long> *__return_storage_ptr__,Schema *this)

{
  unsigned_long uVar1;
  bool bVar2;
  unsigned_long *puVar3;
  unsigned_long iScope;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> local_68;
  Range<unsigned_long> *local_58;
  Range<unsigned_long> *__range1;
  Reader local_48;
  Schema *local_18;
  Schema *this_local;
  Array<unsigned_long> *result;
  
  local_18 = this;
  this_local = (Schema *)__return_storage_ptr__;
  getProto(&local_48,this);
  bVar2 = capnp::schema::Node::Reader::getIsGeneric(&local_48);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __range1._7_1_ = 0;
    kj::heapArray<unsigned_long>(__return_storage_ptr__,(ulong)this->raw->scopeCount);
    local_68 = kj::indices<kj::Array<unsigned_long>&>(__return_storage_ptr__);
    local_58 = &local_68;
    __end1 = kj::Range<unsigned_long>::begin(local_58);
    iScope = (unsigned_long)kj::Range<unsigned_long>::end(local_58);
    while( true ) {
      bVar2 = kj::Range<unsigned_long>::Iterator::operator==(&__end1,(Iterator *)&iScope);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end1);
      uVar1 = this->raw->scopes[*puVar3].typeId;
      puVar3 = kj::Array<unsigned_long>::operator[](__return_storage_ptr__,*puVar3);
      *puVar3 = uVar1;
      kj::Range<unsigned_long>::Iterator::operator++(&__end1);
    }
  }
  else {
    kj::Array<unsigned_long>::Array(__return_storage_ptr__,(void *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<uint64_t> Schema::getGenericScopeIds() const {
  if (!getProto().getIsGeneric())
    return nullptr;

  auto result = kj::heapArray<uint64_t>(raw->scopeCount);
  for (auto iScope: kj::indices(result)) {
    result[iScope] = raw->scopes[iScope].typeId;
  }

  return result;
}